

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-contact-ekf-flex-estimator-imu.cpp
# Opt level: O3

void __thiscall
stateObservation::flexibilityEstimation::FixedContactEKFFlexEstimatorIMU::resetCovarianceMatrices
          (FixedContactEKFFlexEstimatorIMU *this)

{
  ExtendedKalmanFilter *this_00;
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double *pdVar6;
  double *pdVar7;
  char *__function;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ActualDstType actualDst_1;
  undefined1 auVar13 [16];
  long lVar21;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined8 uVar26;
  int iVar27;
  undefined4 uVar28;
  Matrix P0;
  assign_op<double,_double> local_71;
  Matrix local_70;
  int local_58;
  int iStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_48;
  Matrix *pMVar5;
  
  iVar4 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  pMVar5 = (Matrix *)CONCAT44(extraout_var,iVar4);
  iVar4 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])(this);
  local_48.m_rhs.m_rows.m_value = CONCAT44(extraout_var_00,iVar4);
  local_48.m_lhs = pMVar5;
  if ((long)(local_48.m_rhs.m_rows.m_value | (ulong)pMVar5) < 0) {
    __function = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_identity_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
LAB_0014d27a:
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,__function);
  }
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
            (&this->R_,
             (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)&local_48,(assign_op<double,_double> *)&local_70);
  auVar3 = _DAT_00183020;
  auVar13 = _DAT_00183010;
  lVar10 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
  if ((2 < lVar10) &&
     (lVar8 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols, 2 < lVar8)) {
    pdVar6 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data;
    pdVar7 = pdVar6 + 1;
    lVar9 = 0;
    iVar4 = (int)DAT_00183030;
    iVar27 = DAT_00183030._4_4_;
    uVar28 = DAT_00183030._12_4_;
    do {
      lVar11 = 0;
      auVar24 = auVar13;
      do {
        auVar23 = auVar24 ^ auVar3;
        bVar22 = auVar23._4_4_ == iVar27 && auVar23._0_4_ < iVar4;
        if (bVar22) {
          dVar25 = 1e-06;
          if (lVar9 != lVar11) {
            dVar25 = 0.0;
          }
          pdVar7[lVar11 + -1] = dVar25;
        }
        if (bVar22) {
          dVar25 = 1e-06;
          if (lVar9 + -1 != lVar11) {
            dVar25 = 0.0;
          }
          pdVar7[lVar11] = dVar25;
        }
        auVar23 = _DAT_00183010;
        lVar11 = lVar11 + 2;
        lVar12 = auVar24._8_8_;
        auVar24._0_8_ = auVar24._0_8_ + 2;
        auVar24._8_8_ = lVar12 + 2;
      } while (lVar11 != 4);
      lVar9 = lVar9 + 1;
      pdVar7 = pdVar7 + lVar10;
    } while (lVar9 != 3);
    if ((5 < lVar10) && (5 < lVar8)) {
      pdVar6 = pdVar6 + lVar10 * 3 + 4;
      lVar8 = 0;
      do {
        lVar9 = 0;
        auVar13 = auVar23;
        do {
          auVar24 = auVar13 ^ auVar3;
          bVar22 = auVar24._4_4_ == iVar27 && auVar24._0_4_ < iVar4;
          if (bVar22) {
            dVar25 = 1e-06;
            if (lVar8 != lVar9) {
              dVar25 = 0.0;
            }
            pdVar6[lVar9 + -1] = dVar25;
          }
          if (bVar22) {
            dVar25 = 1e-06;
            if (lVar8 + -1 != lVar9) {
              dVar25 = 0.0;
            }
            pdVar6[lVar9] = dVar25;
          }
          lVar9 = lVar9 + 2;
          lVar11 = auVar13._8_8_;
          auVar13._0_8_ = auVar13._0_8_ + 2;
          auVar13._8_8_ = lVar11 + 2;
        } while (lVar9 != 4);
        lVar8 = lVar8 + 1;
        pdVar6 = pdVar6 + lVar10;
      } while (lVar8 != 3);
      local_58 = iVar27;
      iStack_54 = iVar27;
      uStack_50 = uVar28;
      uStack_4c = uVar28;
      (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
        _vptr_FlexibilityEstimatorBase[0x22])(this);
      this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
      KalmanFilterBase::getQmatrixIdentity((Qmatrix *)&local_48,&this_00->super_KalmanFilterBase);
      pMVar5 = (Matrix *)
               (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data;
      (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)local_48.m_lhs;
      uVar1 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows;
      uVar2 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols;
      (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           local_48.m_rhs.m_rows.m_value;
      (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           local_48.m_rhs.m_cols.m_value;
      local_48.m_lhs = pMVar5;
      local_48.m_rhs.m_rows.m_value = uVar1;
      local_48.m_rhs.m_cols.m_value = uVar2;
      free(pMVar5);
      uVar1 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows;
      uVar2 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols;
      if (-1 < (long)(uVar2 | uVar1)) {
        pMVar5 = &this->Q_;
        local_48.m_rhs.m_functor.m_other = 1e-08;
        local_48.m_lhs = pMVar5;
        local_48.m_rhs.m_rows.m_value = uVar1;
        local_48.m_rhs.m_cols.m_value = uVar2;
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
                  (pMVar5,&local_48,(assign_op<double,_double> *)&local_70);
        auVar3 = _DAT_00183020;
        auVar13 = _DAT_00183010;
        lVar10 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        if ((lVar10 < 9) ||
           (lVar8 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols, lVar8 < 9)) goto LAB_0014d22f;
        pdVar7 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        pdVar6 = pdVar7 + lVar10 * 6 + 7;
        lVar9 = 0;
        lVar11 = 0;
        do {
          lVar12 = 0;
          auVar23 = auVar13;
          do {
            bVar22 = SUB164(auVar23 ^ auVar3,4) == local_58 &&
                     SUB164(auVar23 ^ auVar3,0) < -0x7ffffffd;
            if (bVar22) {
              uVar26 = 0x3f1a36e2eb1c432d;
              if (lVar9 != lVar12) {
                uVar26 = 0;
              }
              *(undefined8 *)((long)pdVar6 + lVar12 + -8) = uVar26;
            }
            if (bVar22) {
              uVar26 = 0x3f1a36e2eb1c432d;
              if (lVar9 + -8 != lVar12) {
                uVar26 = 0;
              }
              *(undefined8 *)((long)pdVar6 + lVar12) = uVar26;
            }
            auVar24 = _DAT_00183010;
            lVar21 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + 2;
            auVar23._8_8_ = lVar21 + 2;
            lVar12 = lVar12 + 0x10;
          } while (lVar12 != 0x20);
          lVar11 = lVar11 + 1;
          lVar9 = lVar9 + 8;
          pdVar6 = pdVar6 + lVar10;
        } while (lVar11 != 3);
        if ((lVar10 < 0xc) || (lVar8 < 0xc)) goto LAB_0014d22f;
        pdVar6 = pdVar7 + lVar10 * 9 + 10;
        lVar9 = 0;
        lVar11 = 0;
        do {
          lVar12 = 0;
          auVar14 = auVar24;
          do {
            bVar22 = SUB164(auVar14 ^ auVar3,4) == local_58 &&
                     SUB164(auVar14 ^ auVar3,0) < -0x7ffffffd;
            if (bVar22) {
              uVar26 = 0x3f1a36e2eb1c432d;
              if (lVar9 != lVar12) {
                uVar26 = 0;
              }
              *(undefined8 *)((long)pdVar6 + lVar12 + -8) = uVar26;
            }
            if (bVar22) {
              uVar26 = 0x3f1a36e2eb1c432d;
              if (lVar9 + -8 != lVar12) {
                uVar26 = 0;
              }
              *(undefined8 *)((long)pdVar6 + lVar12) = uVar26;
            }
            auVar13 = _DAT_00183010;
            lVar21 = auVar14._8_8_;
            auVar14._0_8_ = auVar14._0_8_ + 2;
            auVar14._8_8_ = lVar21 + 2;
            lVar12 = lVar12 + 0x10;
          } while (lVar12 != 0x20);
          lVar11 = lVar11 + 1;
          lVar9 = lVar9 + 8;
          pdVar6 = pdVar6 + lVar10;
        } while (lVar11 != 3);
        if ((lVar10 < 0xf) || (lVar8 < 0xf)) goto LAB_0014d22f;
        pdVar6 = pdVar7 + lVar10 * 0xc + 0xd;
        lVar9 = 0;
        lVar11 = 0;
        do {
          lVar12 = 0;
          auVar15 = auVar13;
          do {
            bVar22 = SUB164(auVar15 ^ auVar3,4) == local_58 &&
                     SUB164(auVar15 ^ auVar3,0) < -0x7ffffffd;
            if (bVar22) {
              uVar26 = 0x3f847ae147ae147b;
              if (lVar9 != lVar12) {
                uVar26 = 0;
              }
              *(undefined8 *)((long)pdVar6 + lVar12 + -8) = uVar26;
            }
            if (bVar22) {
              uVar26 = 0x3f847ae147ae147b;
              if (lVar9 + -8 != lVar12) {
                uVar26 = 0;
              }
              *(undefined8 *)((long)pdVar6 + lVar12) = uVar26;
            }
            auVar24 = _DAT_00183010;
            lVar21 = auVar15._8_8_;
            auVar15._0_8_ = auVar15._0_8_ + 2;
            auVar15._8_8_ = lVar21 + 2;
            lVar12 = lVar12 + 0x10;
          } while (lVar12 != 0x20);
          lVar11 = lVar11 + 1;
          lVar9 = lVar9 + 8;
          pdVar6 = pdVar6 + lVar10;
        } while (lVar11 != 3);
        if ((lVar10 < 0x12) || (lVar8 < 0x12)) goto LAB_0014d22f;
        pdVar7 = pdVar7 + lVar10 * 0xf + 0x10;
        lVar8 = 0;
        lVar9 = 0;
        do {
          lVar11 = 0;
          auVar16 = auVar24;
          do {
            bVar22 = SUB164(auVar16 ^ auVar3,4) == local_58 &&
                     SUB164(auVar16 ^ auVar3,0) < -0x7ffffffd;
            if (bVar22) {
              uVar26 = 0x3f847ae147ae147b;
              if (lVar8 != lVar11) {
                uVar26 = 0;
              }
              *(undefined8 *)((long)pdVar7 + lVar11 + -8) = uVar26;
            }
            if (bVar22) {
              uVar26 = 0x3f847ae147ae147b;
              if (lVar8 + -8 != lVar11) {
                uVar26 = 0;
              }
              *(undefined8 *)((long)pdVar7 + lVar11) = uVar26;
            }
            lVar12 = auVar16._8_8_;
            auVar16._0_8_ = auVar16._0_8_ + 2;
            auVar16._8_8_ = lVar12 + 2;
            lVar11 = lVar11 + 0x10;
          } while (lVar11 != 0x20);
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + 8;
          pdVar7 = pdVar7 + lVar10;
        } while (lVar9 != 3);
        KalmanFilterBase::setQ(&this_00->super_KalmanFilterBase,pMVar5);
        KalmanFilterBase::getQmatrixIdentity(&local_70,&this_00->super_KalmanFilterBase);
        if (-1 < (local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols |
                 local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                 .m_rows)) {
          local_48.m_rhs.m_rows.m_value =
               local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows;
          local_48.m_rhs.m_cols.m_value =
               local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_cols;
          local_48.m_rhs.m_functor.m_other = 0.01;
          local_48.m_lhs = &local_70;
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::assign_op<double,double>>
                    (&local_70,&local_48,&local_71);
          auVar3 = _DAT_00183020;
          auVar13 = _DAT_00183010;
          if ((8 < local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows) &&
             (8 < local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols)) {
            pdVar7 = local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data +
                     local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows * 6 + 7;
            lVar10 = 0;
            lVar8 = 0;
            do {
              lVar9 = 0;
              auVar17 = auVar13;
              do {
                bVar22 = SUB164(auVar17 ^ auVar3,4) == local_58 &&
                         SUB164(auVar17 ^ auVar3,0) < -0x7ffffffd;
                if (bVar22) {
                  uVar26 = 0x3f847ae147ae147b;
                  if (lVar10 != lVar9) {
                    uVar26 = 0;
                  }
                  *(undefined8 *)((long)pdVar7 + lVar9 + -8) = uVar26;
                }
                if (bVar22) {
                  uVar26 = 0x3f847ae147ae147b;
                  if (lVar10 + -8 != lVar9) {
                    uVar26 = 0;
                  }
                  *(undefined8 *)((long)pdVar7 + lVar9) = uVar26;
                }
                auVar24 = _DAT_00183010;
                lVar11 = auVar17._8_8_;
                auVar17._0_8_ = auVar17._0_8_ + 2;
                auVar17._8_8_ = lVar11 + 2;
                lVar9 = lVar9 + 0x10;
              } while (lVar9 != 0x20);
              lVar8 = lVar8 + 1;
              lVar10 = lVar10 + 8;
              pdVar7 = pdVar7 + local_70.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_rows;
            } while (lVar8 != 3);
            if ((0xb < local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows) &&
               (0xb < local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols)) {
              pdVar7 = local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data +
                       local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows * 9 + 10;
              lVar10 = 0;
              lVar8 = 0;
              do {
                lVar9 = 0;
                auVar18 = auVar24;
                do {
                  bVar22 = SUB164(auVar18 ^ auVar3,4) == local_58 &&
                           SUB164(auVar18 ^ auVar3,0) < -0x7ffffffd;
                  if (bVar22) {
                    uVar26 = 0x3f847ae147ae147b;
                    if (lVar10 != lVar9) {
                      uVar26 = 0;
                    }
                    *(undefined8 *)((long)pdVar7 + lVar9 + -8) = uVar26;
                  }
                  if (bVar22) {
                    uVar26 = 0x3f847ae147ae147b;
                    if (lVar10 + -8 != lVar9) {
                      uVar26 = 0;
                    }
                    *(undefined8 *)((long)pdVar7 + lVar9) = uVar26;
                  }
                  auVar13 = _DAT_00183010;
                  lVar11 = auVar18._8_8_;
                  auVar18._0_8_ = auVar18._0_8_ + 2;
                  auVar18._8_8_ = lVar11 + 2;
                  lVar9 = lVar9 + 0x10;
                } while (lVar9 != 0x20);
                lVar8 = lVar8 + 1;
                lVar10 = lVar10 + 8;
                pdVar7 = pdVar7 + local_70.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_rows;
              } while (lVar8 != 3);
              if ((0xe < local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_rows) &&
                 (0xe < local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols)) {
                pdVar7 = local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_data +
                         local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_rows * 0xc + 0xd;
                lVar10 = 0;
                lVar8 = 0;
                do {
                  lVar9 = 0;
                  auVar19 = auVar13;
                  do {
                    bVar22 = SUB164(auVar19 ^ auVar3,4) == local_58 &&
                             SUB164(auVar19 ^ auVar3,0) < -0x7ffffffd;
                    if (bVar22) {
                      uVar26 = 0x3f847ae147ae147b;
                      if (lVar10 != lVar9) {
                        uVar26 = 0;
                      }
                      *(undefined8 *)((long)pdVar7 + lVar9 + -8) = uVar26;
                    }
                    if (bVar22) {
                      uVar26 = 0x3f847ae147ae147b;
                      if (lVar10 + -8 != lVar9) {
                        uVar26 = 0;
                      }
                      *(undefined8 *)((long)pdVar7 + lVar9) = uVar26;
                    }
                    auVar24 = _DAT_00183010;
                    lVar11 = auVar19._8_8_;
                    auVar19._0_8_ = auVar19._0_8_ + 2;
                    auVar19._8_8_ = lVar11 + 2;
                    lVar9 = lVar9 + 0x10;
                  } while (lVar9 != 0x20);
                  lVar8 = lVar8 + 1;
                  lVar10 = lVar10 + 8;
                  pdVar7 = pdVar7 + local_70.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_rows;
                } while (lVar8 != 3);
                if ((0x11 < local_70.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_rows) &&
                   (0x11 < local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           .m_storage.m_cols)) {
                  pdVar7 = local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           .m_storage.m_data +
                           local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           .m_storage.m_rows * 0xf + 0x10;
                  lVar10 = 0;
                  lVar8 = 0;
                  do {
                    lVar9 = 0;
                    auVar20 = auVar24;
                    do {
                      bVar22 = SUB164(auVar20 ^ auVar3,4) == local_58 &&
                               SUB164(auVar20 ^ auVar3,0) < -0x7ffffffd;
                      if (bVar22) {
                        uVar26 = 0x3f847ae147ae147b;
                        if (lVar10 != lVar9) {
                          uVar26 = 0;
                        }
                        *(undefined8 *)((long)pdVar7 + lVar9 + -8) = uVar26;
                      }
                      if (bVar22) {
                        uVar26 = 0x3f847ae147ae147b;
                        if (lVar10 + -8 != lVar9) {
                          uVar26 = 0;
                        }
                        *(undefined8 *)((long)pdVar7 + lVar9) = uVar26;
                      }
                      lVar11 = auVar20._8_8_;
                      auVar20._0_8_ = auVar20._0_8_ + 2;
                      auVar20._8_8_ = lVar11 + 2;
                      lVar9 = lVar9 + 0x10;
                    } while (lVar9 != 0x20);
                    lVar8 = lVar8 + 1;
                    lVar10 = lVar10 + 8;
                    pdVar7 = pdVar7 + local_70.
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                      .m_storage.m_rows;
                  } while (lVar8 != 3);
                  KalmanFilterBase::setStateCovariance(&this_00->super_KalmanFilterBase,&local_70);
                  free(local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_data);
                  return;
                }
              }
            }
          }
          goto LAB_0014d22f;
        }
      }
      __function = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
      ;
      goto LAB_0014d27a;
    }
  }
LAB_0014d22f:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
               );
}

Assistant:

void FixedContactEKFFlexEstimatorIMU::resetCovarianceMatrices()
{
  R_ = Matrix::Identity(getMeasurementSize(), getMeasurementSize());
  R_.block(0, 0, 3, 3) = Matrix3::Identity() * 1.e-6; // accelerometer
  R_.block(3, 3, 3, 3) = Matrix3::Identity() * 1.e-6; // gyrometer

  updateCovarianceMatrix_();

  Q_ = ekf_.getQmatrixIdentity();
  Q_ = Q_ * 1.e-8;
  Q_.block(indexes::linVel, indexes::linVel, 3, 3) = Matrix3::Identity() * 1.e-4;
  Q_.block(indexes::angVel, indexes::angVel, 3, 3) = Matrix3::Identity() * 1.e-4;
  Q_.block(indexes::linAcc, indexes::linAcc, 3, 3) = Matrix3::Identity() * 1.e-2;
  Q_.block(indexes::angAcc, indexes::angAcc, 3, 3) = Matrix3::Identity() * 1.e-2;

  ekf_.setQ(Q_);

  Matrix P0(ekf_.getQmatrixIdentity());
  P0 = P0 * 1e-2;
  P0.block(indexes::linVel, indexes::linVel, 3, 3) = Matrix3::Identity() * 1.e-2;
  P0.block(indexes::angVel, indexes::angVel, 3, 3) = Matrix3::Identity() * 1.e-2;
  P0.block(indexes::linAcc, indexes::linAcc, 3, 3) = Matrix3::Identity() * 1.e-2;
  P0.block(indexes::angAcc, indexes::angAcc, 3, 3) = Matrix3::Identity() * 1.e-2;

  ekf_.setStateCovariance(P0);
}